

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

void __thiscall E64::settings_t::settings_t(settings_t *this)

{
  char *pcVar1;
  long *plVar2;
  settings_t *this_00;
  DIR *pDVar3;
  long *in_RDI;
  int times;
  char *iterator;
  int local_14;
  
  pcVar1 = getenv("HOME");
  snprintf((char *)(in_RDI + 0x21),0x100,"%s",pcVar1);
  plVar2 = in_RDI + 0x21;
  local_14 = 0;
  while (local_14 < 3) {
    if (((char)*plVar2 == '/') || ((char)*plVar2 == '\0')) {
      local_14 = local_14 + 1;
    }
    plVar2 = (long *)((long)plVar2 + 1);
  }
  this_00 = (settings_t *)((long)plVar2 + -1);
  *(char *)&this_00->settings_directory = '\0';
  strcpy((char *)(in_RDI + 1),(char *)(in_RDI + 0x21));
  strcpy((char *)(in_RDI + 0x61),(char *)(in_RDI + 1));
  printf("[Settings] user home directory: %s\n",in_RDI + 1);
  snprintf((char *)this_00,0x100,"/.E64-II");
  printf("[Settings] opening settings directory: %s\n",in_RDI + 0x21);
  pDVar3 = opendir((char *)(in_RDI + 0x21));
  *in_RDI = (long)pDVar3;
  if (*in_RDI == 0) {
    printf("[Settings] error: directory doesn\'t exist. Trying to make it...\n");
    mkdir((char *)(in_RDI + 0x21),0x1ff);
    pDVar3 = opendir((char *)(in_RDI + 0x21));
    *in_RDI = (long)pDVar3;
  }
  snprintf((char *)(in_RDI + 0x41),0x100,"%s/kernel.bin",in_RDI + 0x21);
  chdir((char *)(in_RDI + 0x21));
  update_current_path_from_settings(this_00);
  return;
}

Assistant:

E64::settings_t::settings_t()
{
	snprintf(settings_path, 256, "%s", getenv("HOME"));     // within apple app container this returns a long path

	// shorten the path name to home and user dir
	char *iterator = settings_path;
	int times = 0;
	while (times < 3) {
		if((*iterator == '/') || (*iterator == '\0')) times++;
		iterator++;
	}
	iterator--;
	*iterator = '\0';   // force '\0' character to terminate string to copy to 'home_dir'
    
	strcpy(home_dir, settings_path);
	strcpy(current_path, home_dir);    // current path defaults to homedir
	printf("[Settings] user home directory: %s\n", home_dir);

	snprintf(iterator, 256, "/.E64-II");
    
	printf("[Settings] opening settings directory: %s\n", settings_path);
	settings_directory = opendir(settings_path);
	if (settings_directory == NULL) {
		printf("[Settings] error: directory doesn't exist. Trying to make it...\n");
		mkdir(settings_path, 0777);
		settings_directory = opendir(settings_path);
	}

	snprintf(path_to_kernel, 256, "%s/kernel.bin", settings_path);

	// switch to settings path and try to update current_path from settings
	chdir(settings_path);
	update_current_path_from_settings();
}